

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O1

size_t __thiscall
ska::detailv3::
sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
::erase(sherwood_v3_table<const_slang::syntax::DefineDirectiveSyntax_*,_const_slang::syntax::DefineDirectiveSyntax_*,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::syntax::DefineDirectiveSyntax_*>_>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::syntax::DefineDirectiveSyntax_*>,_8UL>_>
        *this,DefineDirectiveSyntax **key)

{
  iterator iVar1;
  EntryPointer psVar2;
  size_t sVar3;
  char cVar4;
  
  iVar1 = find(this,key);
  if (iVar1.current == this->entries + this->num_slots_minus_one + (long)this->max_lookups) {
    sVar3 = 0;
  }
  else {
    (iVar1.current)->distance_from_desired = -1;
    this->num_elements = this->num_elements - 1;
    cVar4 = iVar1.current[1].distance_from_desired;
    sVar3 = 1;
    if ('\0' < cVar4) {
      psVar2 = iVar1.current + 2;
      do {
        psVar2[-2].field_1 = psVar2[-1].field_1;
        psVar2[-2].distance_from_desired = cVar4 + -1;
        psVar2[-1].distance_from_desired = -1;
        cVar4 = psVar2->distance_from_desired;
        psVar2 = psVar2 + 1;
      } while ('\0' < cVar4);
    }
  }
  return sVar3;
}

Assistant:

size_t erase(const FindKey & key)
    {
        auto found = find(key);
        if (found == end())
            return 0;
        else
        {
            erase(found);
            return 1;
        }
    }